

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O0

string * sqlcheck::GetTableName(string *__return_storage_ptr__,string *sql_statement)

{
  undefined8 uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  string local_100 [32];
  string local_e0 [32];
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> rest;
  size_t found;
  allocator local_39;
  string local_38 [8];
  string table_template;
  string *sql_statement_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *table_name;
  
  table_template.field_2._8_8_ = sql_statement;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"create table",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  lVar2 = std::__cxx11::string::find((string *)table_template.field_2._8_8_,(ulong)local_38);
  uVar1 = table_template.field_2._8_8_;
  if (lVar2 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"",(allocator *)(rest.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(rest.field_2._M_local_buf + 0xf));
    rest.field_2._8_4_ = 1;
  }
  else {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_80,uVar1);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&local_c0,"^ +| +$|( ) +",0x10);
    std::
    regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
              (&local_a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
               &local_c0,"$1",0);
    std::__cxx11::string::operator=((string *)local_80,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_c0);
    uVar3 = std::__cxx11::string::find((char)local_80,0x20);
    uVar4 = std::__cxx11::string::find((char)local_80,0x28);
    if (uVar3 < uVar4) {
      std::__cxx11::string::find((char)local_80,0x20);
      std::__cxx11::string::substr((ulong)local_e0,(ulong)local_80);
      std::__cxx11::string::operator=((string *)local_80,local_e0);
      std::__cxx11::string::~string(local_e0);
    }
    else {
      std::__cxx11::string::find((char)local_80,0x28);
      std::__cxx11::string::substr((ulong)local_100,(ulong)local_80);
      std::__cxx11::string::operator=((string *)local_80,local_100);
      std::__cxx11::string::~string(local_100);
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_80);
    rest.field_2._8_4_ = 1;
    std::__cxx11::string::~string((string *)local_80);
  }
  std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string GetTableName(const std::string& sql_statement){
  std::string table_template = "create table";
  std::size_t found = sql_statement.find(table_template);
  if (found == std::string::npos) {
    return "";
  }

  // Locate table name
  auto rest = sql_statement.substr(found + table_template.size());
  // Strip space at beginning
  rest = std::regex_replace(rest, std::regex("^ +| +$|( ) +"), "$1");
  // check if space or ( comes first in remaining string
  if (rest.find(' ') < rest.find('(')) {
    // space comes first
    rest = rest.substr(0, rest.find(' '));
  } else {
    // ( comes first
    rest = rest.substr(0, rest.find('('));
  }
  auto table_name = rest;

  return table_name;
}